

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.h
# Opt level: O0

Relations dg::vr::RelationsAnalyzer::getCommon<unsigned_long,llvm::Value_const*>
                    (VRLocation *location,unsigned_long *lt,Relations known,Value **rt)

{
  bool bVar1;
  reference ppVVar2;
  _WordT in_RDX;
  long in_RDI;
  ValueRelations *predRels;
  VREdge *predEdge;
  const_iterator __end3;
  const_iterator __begin3;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *__range3;
  _Base_bitset<1UL> in_stack_ffffffffffffffa8;
  UniqueBucketSet *in_stack_ffffffffffffffb0;
  __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
  local_38;
  long local_30;
  bitset<12UL> local_10;
  _Base_bitset<1UL> local_8;
  
  local_30 = in_RDI + 0xf0;
  local_10.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)in_RDX;
  local_38._M_current =
       (VREdge **)
       std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::begin
                 ((vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *)
                  in_stack_ffffffffffffffa8._M_w);
  std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::end
            ((vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *)
             in_stack_ffffffffffffffa8._M_w);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                        *)in_stack_ffffffffffffffa8._M_w);
    if (!bVar1) {
      return (Relations)local_10.super__Base_bitset<1UL>._M_w;
    }
    ppVVar2 = __gnu_cxx::
              __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
              ::operator*(&local_38);
    in_stack_ffffffffffffffb0 = &(((((ValueRelations *)*ppVVar2)->graph).reported)->graph).buckets;
    in_stack_ffffffffffffffa8._M_w =
         (_WordT)ValueRelations::between<unsigned_long,llvm::Value_const*>
                           ((ValueRelations *)*ppVVar2,(unsigned_long *)in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8._M_w);
    Relations::operator&=
              ((Relations *)in_stack_ffffffffffffffb0,(Relations *)in_stack_ffffffffffffffa8._M_w);
    bVar1 = Relations::any((Relations *)0x1d69a0);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
    ::operator++(&local_38);
  }
  memset(&local_8,0,8);
  Relations::Relations((Relations *)0x1d69bf);
  return (Relations)local_8._M_w;
}

Assistant:

static Relations getCommon(const VRLocation &location, const X &lt,
                               Relations known, const Y &rt) {
        for (VREdge *predEdge : location.predecessors) {
            const ValueRelations &predRels = predEdge->source->relations;
            known &= predRels.between(lt, rt);
            if (!known.any())
                return Relations();
        }
        return known;
    }